

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O0

uint64_t create_indent(int level,uint64_t old_indent,lys_node *node,int shorthand,
                      lys_module *sub_module,lys_node *aug_parent)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  LY_ERR *pLVar4;
  lys_node *plVar5;
  int has_next;
  int is_case;
  int next_is_case;
  uint64_t new_indent;
  lys_node *aug_parent_local;
  lys_module *sub_module_local;
  int shorthand_local;
  lys_node *node_local;
  uint64_t old_indent_local;
  ulong uStack_10;
  int level_local;
  
  bVar2 = false;
  bVar1 = false;
  if (level < 0x41) {
    if ((node->nodetype == LYS_CASE) || (shorthand != 0)) {
      bVar1 = true;
    }
    if (((((!bVar1) && (plVar5 = lys_parent(node), plVar5 != (lys_node *)0x0)) &&
         (plVar5 = lys_parent(node), (plVar5->nodetype & (LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN)) &&
        ((node->next != (lys_node *)0x0 &&
         (plVar5 = lys_parent(node->next), plVar5 != (lys_node *)0x0)))) &&
       (plVar5 = lys_parent(node->next), plVar5->nodetype == LYS_CHOICE)) {
      bVar2 = true;
    }
    iVar3 = sibling_is_valid_child(node,0,sub_module,aug_parent,node->nodetype);
    _is_case = old_indent;
    if ((iVar3 != 0) && (!bVar2)) {
      _is_case = 1L << ((char)level - 1U & 0x3f) | old_indent;
    }
    uStack_10 = _is_case;
  }
  else {
    pLVar4 = ly_errno_location();
    *pLVar4 = LY_EINT;
    ly_log(LY_LLERR,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/printer_tree.c"
           ,0x82);
    uStack_10 = 0;
  }
  return uStack_10;
}

Assistant:

uint64_t
create_indent(int level, uint64_t old_indent, const struct lys_node *node, int shorthand,
              const struct lys_module *sub_module, struct lys_node *aug_parent)
{
    uint64_t new_indent;
    int next_is_case = 0, is_case = 0, has_next = 0;

    if (level > 64) {
        LOGINT;
        return 0;
    }

    new_indent = old_indent;

    /* this is the indent of a case (standard or shorthand) */
    if ((node->nodetype == LYS_CASE) || shorthand) {
        is_case = 1;
    }

    /* this is the direct child of a case */
    if (!is_case && lys_parent(node) && (lys_parent(node)->nodetype & (LYS_CASE | LYS_CHOICE))) {
        /* it is not the only child */
        if (node->next && lys_parent(node->next) && (lys_parent(node->next)->nodetype == LYS_CHOICE)) {
            next_is_case = 1;
        }
    }

    /* next is a node that will actually be printed */
    has_next = sibling_is_valid_child(node, 0, sub_module, aug_parent, node->nodetype);

    if (has_next && !next_is_case) {
        new_indent |= (uint64_t)1 << (level - 1);
    }

    return new_indent;
}